

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int c,int type)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  undefined8 *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Mat *in_stack_00000008;
  Mat m;
  Mat *this_00;
  Mat local_50;
  Mat *pMVar2;
  int _c;
  
  this_00 = in_RDI;
  pMVar2 = in_RDI;
  (**(code **)*in_RSI)(&local_50,in_RSI,in_EDX * in_ECX * in_R8D,in_R9D);
  _c = (int)((ulong)pMVar2 >> 0x20);
  bVar1 = Mat::empty(this_00);
  if (bVar1) {
    Mat::Mat(this_00,&local_50);
  }
  else {
    Mat::reshape(in_stack_00000008,unaff_retaddr_00,unaff_retaddr,_c);
  }
  Mat::~Mat((Mat *)0x15093f);
  return in_RDI;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}